

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyze.cpp
# Opt level: O3

void duckdb::roaring::RoaringAnalyzeState::HandleRaggedByte
               (RoaringAnalyzeState *state,uint8_t array_index,idx_t relevant_bits)

{
  short sVar1;
  byte bVar2;
  undefined1 auVar3 [16];
  idx_t iVar4;
  uint16_t uVar5;
  uint uVar6;
  uint16_t uVar7;
  uint16_t uVar8;
  undefined1 auVar9 [16];
  
  auVar3 = _DAT_01353c60;
  if (relevant_bits != 0) {
    uVar5 = state->run_count;
    uVar7 = state->one_count;
    uVar8 = state->zero_count;
    sVar1 = (short)*(undefined4 *)&state->count;
    iVar4 = 0;
    bVar2 = state->last_bit_set;
    do {
      uVar6 = 1 << ((byte)iVar4 & 0x1f) & (uint)array_index;
      if ((uVar6 == 0) && (-sVar1 == (short)iVar4 || (bVar2 & 1) != 0)) {
        uVar5 = uVar5 + 1;
        state->run_count = uVar5;
      }
      auVar9._1_7_ = 0;
      auVar9[0] = uVar6 != 0;
      auVar9[8] = uVar6 == 0;
      auVar9._9_7_ = 0;
      auVar9 = packssdw(auVar9 & auVar3,auVar9 & auVar3);
      auVar9 = packssdw(auVar9,auVar9);
      uVar7 = uVar7 + auVar9._0_2_;
      uVar8 = uVar8 + auVar9._2_2_;
      iVar4 = iVar4 + 1;
      bVar2 = uVar6 != 0;
    } while (relevant_bits != iVar4);
    state->count = sVar1 + (short)relevant_bits;
    state->last_bit_set = uVar6 != 0;
    state->one_count = uVar7;
    state->zero_count = uVar8;
  }
  return;
}

Assistant:

void RoaringAnalyzeState::HandleRaggedByte(RoaringAnalyzeState &state, uint8_t array_index, idx_t relevant_bits) {
	D_ASSERT(relevant_bits <= 8);
	for (idx_t i = 0; i < relevant_bits; i++) {
		const bool bit_set = array_index & (1 << i);
		HandleBit(state, bit_set);
	}
}